

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_pushdown.cpp
# Opt level: O1

bool duckdb::LimitPushdown::CanOptimize(LogicalOperator *op)

{
  bool bVar1;
  byte bVar2;
  reference this;
  pointer pLVar3;
  LogicalLimit *pLVar4;
  
  if (op->type == LOGICAL_LIMIT) {
    this = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](&op->children,0);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this);
    if (pLVar3->type == LOGICAL_PROJECTION) {
      pLVar4 = LogicalOperator::Cast<duckdb::LogicalLimit>(op);
      if ((byte)((pLVar4->offset_val).type - EXPRESSION_VALUE) < 2) {
        bVar2 = 0;
LAB_011930bf:
        bVar1 = false;
      }
      else {
        if ((pLVar4->limit_val).type == CONSTANT_VALUE) {
          pLVar4 = (LogicalLimit *)BoundLimitNode::GetConstantValue(&pLVar4->limit_val);
          if (pLVar4 < (LogicalLimit *)0x2000) {
            bVar2 = 1;
            goto LAB_011930bf;
          }
        }
        bVar2 = (byte)pLVar4;
        bVar1 = true;
      }
      if (!bVar1) goto LAB_011930e9;
    }
  }
  bVar2 = 0;
LAB_011930e9:
  return (bool)(bVar2 & 1);
}

Assistant:

bool LimitPushdown::CanOptimize(duckdb::LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_LIMIT &&
	    op.children[0]->type == LogicalOperatorType::LOGICAL_PROJECTION) {
		auto &limit = op.Cast<LogicalLimit>();

		if (limit.offset_val.Type() == LimitNodeType::EXPRESSION_PERCENTAGE ||
		    limit.offset_val.Type() == LimitNodeType::EXPRESSION_VALUE) {
			// Offset cannot be an expression
			return false;
		}

		if (limit.limit_val.Type() == LimitNodeType::CONSTANT_VALUE && limit.limit_val.GetConstantValue() < 8192) {
			// Push down only when limit value is smaller than 8192.
			// when physical_limit is introduced, it will end a parallel pipeline
			// restrict the limit value to be small so that remaining operations run fast without parallelization.
			return true;
		}
	}
	return false;
}